

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O1

int maybe_bind_socket(int fd)

{
  int iVar1;
  int *piVar2;
  socklen_t local_30;
  undefined1 local_2c [4];
  socklen_t slen;
  uv__sockaddr s;
  int fd_local;
  
  local_30 = 0x1c;
  s._20_4_ = fd;
  memset(local_2c,0,0x1c);
  iVar1 = getsockname(s._20_4_,(sockaddr *)local_2c,&local_30);
  if (iVar1 == 0) {
    if ((local_2c._0_2_ == 2) && (local_2c._2_2_ != 0)) {
      s.in6.sin6_scope_id = 0;
    }
    else if ((local_2c._0_2_ == 10) && (local_2c._2_2_ != 0)) {
      s.in6.sin6_scope_id = 0;
    }
    else {
      iVar1 = bind(s._20_4_,(sockaddr *)local_2c,local_30);
      if (iVar1 == 0) {
        s.in6.sin6_scope_id = 0;
      }
      else {
        piVar2 = __errno_location();
        s.in6.sin6_scope_id = -*piVar2;
      }
    }
  }
  else {
    piVar2 = __errno_location();
    s.in6.sin6_scope_id = -*piVar2;
  }
  return s.in6.sin6_scope_id;
}

Assistant:

static int maybe_bind_socket(int fd) {
  union uv__sockaddr s;
  socklen_t slen;

  slen = sizeof(s);
  memset(&s, 0, sizeof(s));

  if (getsockname(fd, &s.addr, &slen))
    return UV__ERR(errno);

  if (s.addr.sa_family == AF_INET)
    if (s.in.sin_port != 0)
      return 0;  /* Already bound to a port. */

  if (s.addr.sa_family == AF_INET6)
    if (s.in6.sin6_port != 0)
      return 0;  /* Already bound to a port. */

  /* Bind to an arbitrary port. */
  if (bind(fd, &s.addr, slen))
    return UV__ERR(errno);

  return 0;
}